

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

bool __thiscall
IMLE<1,_1,_FastLinearExpert>::save(IMLE<1,_1,_FastLinearExpert> *this,string *filename)

{
  byte bVar1;
  undefined8 uVar2;
  IMLE<1,_1,_FastLinearExpert> *in_RDI;
  text_oarchive archive;
  ofstream fs;
  IMLE<1,_1,_FastLinearExpert> *in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd24;
  ostream *in_stack_fffffffffffffd28;
  text_oarchive *in_stack_fffffffffffffd30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  char *in_stack_fffffffffffffd58;
  string local_248 [48];
  undefined1 local_218 [535];
  byte local_1;
  
  uVar2 = std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_218,uVar2,0x10);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::operator+(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
    message(in_RDI,(string *)in_stack_fffffffffffffd08);
    std::__cxx11::string::~string(local_248);
    local_1 = 0;
  }
  else {
    boost::archive::text_oarchive::text_oarchive
              (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
               CONCAT13(bVar1,(int3)in_stack_fffffffffffffd24));
    boost::archive::detail::interface_oarchive<boost::archive::text_oarchive>::operator&
              ((interface_oarchive<boost::archive::text_oarchive> *)in_RDI,in_stack_fffffffffffffd08
              );
    std::ofstream::close();
    local_1 = 1;
    boost::archive::text_oarchive::~text_oarchive((text_oarchive *)0x23c6e6);
  }
  std::ofstream::~ofstream(local_218);
  return (bool)(local_1 & 1);
}

Assistant:

IMLE_CLASS_TEMPLATE
bool IMLE_base::save(std::string const &filename)
{
    std::ofstream fs(filename.c_str());

	if( !fs.is_open() )
	{
		message(OPENERR + filename);
		return false;
	}
    boost::archive::text_oarchive archive(fs);

	archive & (*this);
    fs.close();

    return true;
}